

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressSequences
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t srcSize)

{
  uint uVar1;
  size_t sVar2;
  XXH64_hash_t XVar3;
  U32 checksum;
  size_t err_code_1;
  size_t err_code;
  size_t frameHeaderSize;
  size_t compressedBlocksSize;
  size_t cSize;
  BYTE *op;
  void *src_local;
  size_t inSeqsSize_local;
  ZSTD_Sequence *inSeqs_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *cctx_local;
  
  if (cctx == (ZSTD_CCtx *)0x0) {
    __assert_fail("cctx != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x1a94,
                  "size_t ZSTD_compressSequences(ZSTD_CCtx *, void *, size_t, const ZSTD_Sequence *, size_t, const void *, size_t)"
                 );
  }
  cctx_local = (ZSTD_CCtx *)ZSTD_CCtx_init_compressStream2(cctx,ZSTD_e_end,srcSize);
  uVar1 = ERR_isError((size_t)cctx_local);
  if (uVar1 == 0) {
    sVar2 = ZSTD_writeFrameHeader(dst,dstCapacity,&cctx->appliedParams,srcSize,cctx->dictID);
    if (((cctx->appliedParams).fParams.checksumFlag != 0) && (srcSize != 0)) {
      ZSTD_XXH64_update(&cctx->xxhState,src,srcSize);
    }
    cctx_local = (ZSTD_CCtx *)
                 ZSTD_compressSequences_internal
                           (cctx,(void *)(sVar2 + (long)dst),dstCapacity - sVar2,inSeqs,inSeqsSize,
                            src,srcSize);
    uVar1 = ERR_isError((size_t)cctx_local);
    if (uVar1 == 0) {
      compressedBlocksSize = (long)&cctx_local->stage + sVar2;
      if ((cctx->appliedParams).fParams.checksumFlag != 0) {
        XVar3 = ZSTD_XXH64_digest(&cctx->xxhState);
        if ((dstCapacity - sVar2) - (long)cctx_local < 4) {
          return 0xffffffffffffffba;
        }
        MEM_writeLE32((void *)((long)dst + compressedBlocksSize),(U32)XVar3);
        compressedBlocksSize = compressedBlocksSize + 4;
      }
      cctx_local = (ZSTD_CCtx *)compressedBlocksSize;
    }
  }
  return (size_t)cctx_local;
}

Assistant:

size_t ZSTD_compressSequences(ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                              const ZSTD_Sequence* inSeqs, size_t inSeqsSize,
                              const void* src, size_t srcSize)
{
    BYTE* op = (BYTE*)dst;
    size_t cSize = 0;
    size_t compressedBlocksSize = 0;
    size_t frameHeaderSize = 0;

    /* Transparent initialization stage, same as compressStream2() */
    DEBUGLOG(4, "ZSTD_compressSequences (dstCapacity=%zu)", dstCapacity);
    assert(cctx != NULL);
    FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, ZSTD_e_end, srcSize), "CCtx initialization failed");
    /* Begin writing output, starting with frame header */
    frameHeaderSize = ZSTD_writeFrameHeader(op, dstCapacity, &cctx->appliedParams, srcSize, cctx->dictID);
    op += frameHeaderSize;
    dstCapacity -= frameHeaderSize;
    cSize += frameHeaderSize;
    if (cctx->appliedParams.fParams.checksumFlag && srcSize) {
        XXH64_update(&cctx->xxhState, src, srcSize);
    }
    /* cSize includes block header size and compressed sequences size */
    compressedBlocksSize = ZSTD_compressSequences_internal(cctx,
                                                           op, dstCapacity,
                                                           inSeqs, inSeqsSize,
                                                           src, srcSize);
    FORWARD_IF_ERROR(compressedBlocksSize, "Compressing blocks failed!");
    cSize += compressedBlocksSize;
    dstCapacity -= compressedBlocksSize;

    if (cctx->appliedParams.fParams.checksumFlag) {
        U32 const checksum = (U32) XXH64_digest(&cctx->xxhState);
        RETURN_ERROR_IF(dstCapacity<4, dstSize_tooSmall, "no room for checksum");
        DEBUGLOG(4, "Write checksum : %08X", (unsigned)checksum);
        MEM_writeLE32((char*)dst + cSize, checksum);
        cSize += 4;
    }

    DEBUGLOG(4, "Final compressed size: %zu", cSize);
    return cSize;
}